

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

unique_ptr<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>_> __thiscall
PCCompatible::Machine::PCCompatible(Machine *this,Target *target,ROMFetcher *rom_fetcher)

{
  int iVar1;
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  *local_58;
  undefined1 local_38 [16];
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  *local_28;
  Target *pc_target;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  
  pc_target = (Target *)rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  if (target == (Target *)0x0) {
    local_58 = (function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
                *)0x0;
  }
  else {
    local_58 = (function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
                *)__dynamic_cast(target,&Analyser::Static::Target::typeinfo,
                                 &Analyser::Static::PCCompatible::Target::typeinfo,0);
  }
  local_28 = local_58;
  iVar1 = *(int *)((long)&local_58[4].super__Function_base._M_functor + 8);
  if (iVar1 == 0) {
    std::
    make_unique<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>,Analyser::Static::PCCompatible::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
              ((Target *)(local_38 + 8),local_58);
    std::unique_ptr<PCCompatible::Machine,std::default_delete<PCCompatible::Machine>>::
    unique_ptr<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>,std::default_delete<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>>,void>
              ((unique_ptr<PCCompatible::Machine,std::default_delete<PCCompatible::Machine>> *)this,
               (unique_ptr<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>,_std::default_delete<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>_>_>
                *)(local_38 + 8));
    std::
    unique_ptr<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>,_std::default_delete<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>_>_>
    ::~unique_ptr((unique_ptr<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>,_std::default_delete<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>_>_>
                   *)(local_38 + 8));
  }
  else if (iVar1 == 1) {
    std::
    make_unique<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>,Analyser::Static::PCCompatible::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
              ((Target *)local_38,local_58);
    std::unique_ptr<PCCompatible::Machine,std::default_delete<PCCompatible::Machine>>::
    unique_ptr<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>,std::default_delete<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>>,void>
              ((unique_ptr<PCCompatible::Machine,std::default_delete<PCCompatible::Machine>> *)this,
               (unique_ptr<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>,_std::default_delete<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>_>_>
                *)local_38);
    std::
    unique_ptr<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>,_std::default_delete<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>_>_>
    ::~unique_ptr((unique_ptr<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>,_std::default_delete<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>_>_>
                   *)local_38);
  }
  else {
    std::unique_ptr<PCCompatible::Machine,std::default_delete<PCCompatible::Machine>>::
    unique_ptr<std::default_delete<PCCompatible::Machine>,void>
              ((unique_ptr<PCCompatible::Machine,std::default_delete<PCCompatible::Machine>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>,_true,_true>
          )(__uniq_ptr_data<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Machine> Machine::PCCompatible(const Analyser::Static::Target *target, const ROMMachine::ROMFetcher &rom_fetcher) {
	const Target *const pc_target = dynamic_cast<const Target *>(target);

	switch(pc_target->adaptor) {
		case Target::VideoAdaptor::MDA:	return std::make_unique<PCCompatible::ConcreteMachine<Target::VideoAdaptor::MDA>>(*pc_target, rom_fetcher);
		case Target::VideoAdaptor::CGA:	return std::make_unique<PCCompatible::ConcreteMachine<Target::VideoAdaptor::CGA>>(*pc_target, rom_fetcher);
		default: return nullptr;
	}
}